

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::doRemoveCols(SPxSolverBase<double> *this,int *perm)

{
  uint uVar1;
  
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<double>::doRemoveCols(&this->super_SPxLPBase<double>,perm);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    SPxBasisBase<double>::removedCols(&this->super_SPxBasisBase<double>,perm);
    uVar1 = (this->super_SPxBasisBase<double>).thestatus + NO_PROBLEM;
    if (uVar1 < 3) {
      setBasisStatus(this,*(SPxStatus *)(&DAT_002dbed0 + (ulong)uVar1 * 4));
      return;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveCols(int perm[])
{
   forceRecompNonbasicValue();

   SPxLPBase<R>::doRemoveCols(perm);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedCols(perm);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::PRIMAL:
      case SPxBasisBase<R>::UNBOUNDED:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::DUAL);
         break;

      default:
         break;
      }
   }
}